

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PointLightCluster.cpp
# Opt level: O3

int __thiscall arealights::PointLightCluster::init(PointLightCluster *this,EVP_PKEY_CTX *ctx)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *psVar2;
  undefined1 auVar3 [8];
  int extraout_EAX;
  int extraout_EAX_00;
  int extraout_EAX_01;
  int iVar4;
  undefined1 local_68 [8];
  long *local_60;
  long local_50 [2];
  string local_40;
  
  psVar2 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  paVar1 = &local_40.field_2;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"../assets/PointLightCluster.vs.glsl","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"../assets/PointLightCluster.fs.glsl","");
  RenderHelper::makeSimpleShader((RenderHelper *)local_68,psVar2,&local_40);
  auVar3 = local_68;
  local_68 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_shader,(pointer)auVar3);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_68);
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  psVar2 = (string *)
           (this->_renderHelper).
           super___shared_ptr<arealights::RenderHelper,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_40._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"../assets/SphereLightVolume.vs.glsl","");
  local_60 = local_50;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"../assets/SphereLightVolume.fs.glsl","");
  RenderHelper::makeSimpleShader((RenderHelper *)local_68,psVar2,&local_40);
  auVar3 = local_68;
  local_68 = (undefined1  [8])0x0;
  std::__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::reset
            ((__uniq_ptr_impl<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)
             &this->_sphereLightVolumeShader,(pointer)auVar3);
  std::unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_>::~unique_ptr
            ((unique_ptr<fw::ShaderProgram,_std::default_delete<fw::ShaderProgram>_> *)local_68);
  iVar4 = extraout_EAX;
  if (local_60 != local_50) {
    operator_delete(local_60,local_50[0] + 1);
    iVar4 = extraout_EAX_00;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != paVar1) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
    iVar4 = extraout_EAX_01;
  }
  return iVar4;
}

Assistant:

void PointLightCluster::init()
{
    _shader = _renderHelper->makeSimpleShader(
        "../assets/PointLightCluster.vs.glsl",
        "../assets/PointLightCluster.fs.glsl"
    );

    _sphereLightVolumeShader = _renderHelper->makeSimpleShader(
        "../assets/SphereLightVolume.vs.glsl",
        "../assets/SphereLightVolume.fs.glsl"
    );
}